

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

shared_ptr<kratos::AssignStmt> __thiscall
kratos::EnumVar::assign_(EnumVar *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  char cVar1;
  bool bVar2;
  undefined8 *puVar3;
  long lVar4;
  VarException *pVVar5;
  InternalException *this_00;
  undefined4 in_register_00000014;
  long *plVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar7;
  basic_string_view<char> bVar8;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  string_view format_str;
  format_args args;
  IRNode *local_a8;
  long local_a0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_98;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::EnumConst> p;
  string local_58;
  allocator_type local_32;
  allocator_type local_31;
  
  plVar6 = (long *)CONCAT44(in_register_00000014,type);
  cVar1 = (**(code **)(*(long *)*plVar6 + 0xd0))();
  if (cVar1 == '\0') {
    pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Cannot assign enum type to non enum type",
               (allocator<char> *)&local_a8);
    p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar6;
    __l._M_len = 2;
    __l._M_array = (iterator)auStack_78;
    auStack_78 = (undefined1  [8])var;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_98,__l,&local_31);
    VarException::VarException(pVVar5,&local_58,&local_98);
    __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)(*plVar6 + 0x168) == 3) {
    Var::as<kratos::EnumConst>((Var *)auStack_78);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((((IRNode *)((long)auStack_78 + 0x270))->comment)._M_string_length +
                            0x40),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(var[0x27].
                                      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 4));
    if (bVar2) {
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Cannot assign different enum type",
                 (allocator<char> *)&local_31);
      local_a0 = *plVar6;
      __l_00._M_len = 2;
      __l_00._M_array = &local_a8;
      local_a8 = (IRNode *)var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_98,__l_00,&local_32);
      VarException::VarException(pVVar5,&local_58,&local_98);
      __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  }
  else {
    puVar3 = (undefined8 *)
             __dynamic_cast(*plVar6,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe);
    if (puVar3 == (undefined8 *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unable to obtain enum definition",(allocator<char> *)&local_98
                );
      InternalException::InternalException(this_00,&local_58);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar4 = (**(code **)*puVar3)(puVar3);
    if (lVar4 == 0) {
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      (**(code **)(*(long *)*plVar6 + 0x100))(&local_98);
      auStack_78 = (undefined1  [8])
                   local_98.
                   super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_98.
           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      bVar8 = fmt::v7::to_string_view<char,_0>
                        (
                        "Cannot obtain enum information from var ({0}). Please use a cast if it\'s intended"
                        );
      format_str.data_ = (char *)bVar8.size_;
      format_str.size_ = 0xd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_78;
      fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar8.data_,format_str,args);
      local_a8 = (IRNode *)*plVar6;
      __l_01._M_len = 1;
      __l_01._M_array = &local_a8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78,__l_01,&local_31);
      VarException::VarException
                (pVVar5,&local_58,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78);
      __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar4 = (**(code **)*puVar3)(puVar3);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar4 + 0x40),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
    if (bVar2) {
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Cannot assign different enum type",
                 (allocator<char> *)&local_a8);
      p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar6;
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)auStack_78;
      auStack_78 = (undefined1  [8])var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_98,__l_02,&local_31);
      VarException::VarException(pVVar5,&local_58,&local_98);
      __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  sVar7 = Var::assign_(&this->super_Var,var,type);
  sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> EnumVar::assign_(const std::shared_ptr<Var> &var,
                                             kratos::AssignmentType type) {
    if (!var->is_enum())
        throw VarException("Cannot assign enum type to non enum type", {this, var.get()});
    if (var->type() == VarType::ConstValue) {
        auto p = var->as<EnumConst>();
        if (p->enum_def()->name != enum_type_->name)
            throw VarException("Cannot assign different enum type", {this, var.get()});
    } else {
        auto *p = dynamic_cast<EnumType *>(var.get());
        if (!p) throw InternalException("Unable to obtain enum definition");
        if (!p->enum_type())
            throw VarException(::format("Cannot obtain enum information from var ({0}). "
                                        "Please use a cast if it's intended",
                                        var->handle_name()),
                               {var.get()});
        if (p->enum_type()->name != enum_type_->name) {
            throw VarException("Cannot assign different enum type", {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}